

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O3

int riscv_csrrw_riscv32(CPURISCVState_conflict *env,int csrno,target_ulong_conflict *ret_value,
                       target_ulong_conflict new_value,target_ulong_conflict write_mask)

{
  target_ulong_conflict *ptVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  target_ulong_conflict old_value;
  uint local_3c;
  target_ulong_conflict *local_38;
  
  uVar3 = env->priv;
  if ((uVar3 == 1 & (byte)env->misa >> 7) == 1) {
    _Var2 = riscv_cpu_virt_enabled_riscv32(env);
    uVar3 = 2 - _Var2;
  }
  iVar5 = -1;
  if (((csrno & 0xc00U) != 0xc00 || write_mask == 0) &&
     (((env->debugger != false || (((uint)csrno >> 8 & 3) <= uVar3)) &&
      (*(char *)((long)env[1].gpr + 0xd) == '\x01')))) {
    if ((csr_ops[csrno].predicate != (riscv_csr_predicate_fn)0x0) &&
       (local_38 = ret_value, iVar4 = (*csr_ops[csrno].predicate)(env,csrno), ptVar1 = local_38,
       -1 < iVar4)) {
      if (csr_ops[csrno].op != (riscv_csr_op_fn)0x0) {
        iVar5 = (*csr_ops[csrno].op)(env,csrno,local_38,new_value,write_mask);
        return iVar5;
      }
      if ((((csr_ops[csrno].read != (riscv_csr_read_fn)0x0) &&
           (iVar5 = (*csr_ops[csrno].read)(env,csrno,&local_3c), -1 < iVar5)) &&
          ((write_mask == 0 ||
           ((csr_ops[csrno].write == (riscv_csr_write_fn)0x0 ||
            (iVar5 = (*csr_ops[csrno].write)
                               (env,csrno,(new_value ^ local_3c) & write_mask ^ local_3c),
            -1 < iVar5)))))) && (iVar5 = 0, ptVar1 != (target_ulong_conflict *)0x0)) {
        *ptVar1 = local_3c;
      }
    }
  }
  return iVar5;
}

Assistant:

int riscv_csrrw(CPURISCVState *env, int csrno, target_ulong *ret_value,
                target_ulong new_value, target_ulong write_mask)
{
    int ret;
    target_ulong old_value;
    RISCVCPU *cpu = env_archcpu(env);

    /* check privileges and return -1 if check fails */
    int effective_priv = env->priv;
    int read_only = get_field(csrno, 0xC00) == 3;

    if (riscv_has_ext(env, RVH) &&
        env->priv == PRV_S &&
        !riscv_cpu_virt_enabled(env)) {
        /*
         * We are in S mode without virtualisation, therefore we are in HS Mode.
         * Add 1 to the effective privledge level to allow us to access the
         * Hypervisor CSRs.
         */
        effective_priv++;
    }

    if ((write_mask && read_only) ||
        (!env->debugger && (effective_priv < get_field(csrno, 0x300)))) {
        return -1;
    }

    /* ensure the CSR extension is enabled. */
    if (!cpu->cfg.ext_icsr) {
        return -1;
    }

    /* check predicate */
    if (!csr_ops[csrno].predicate || csr_ops[csrno].predicate(env, csrno) < 0) {
        return -1;
    }

    /* execute combined read/write operation if it exists */
    if (csr_ops[csrno].op) {
        return csr_ops[csrno].op(env, csrno, ret_value, new_value, write_mask);
    }

    /* if no accessor exists then return failure */
    if (!csr_ops[csrno].read) {
        return -1;
    }

    /* read old value */
    ret = csr_ops[csrno].read(env, csrno, &old_value);
    if (ret < 0) {
        return ret;
    }

    /* write value if writable and write mask set, otherwise drop writes */
    if (write_mask) {
        new_value = (old_value & ~write_mask) | (new_value & write_mask);
        if (csr_ops[csrno].write) {
            ret = csr_ops[csrno].write(env, csrno, new_value);
            if (ret < 0) {
                return ret;
            }
        }
    }

    /* return old value */
    if (ret_value) {
        *ret_value = old_value;
    }

    return 0;
}